

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

UnaryPropertyExprSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::UnaryPropertyExprSyntax,slang::parsing::Token&,slang::syntax::PropertyExprSyntax&>
          (BumpAllocator *this,Token *args,PropertyExprSyntax *args_1)

{
  Token op;
  UnaryPropertyExprSyntax *pUVar1;
  BumpAllocator *in_RDX;
  Info *in_RSI;
  size_t in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  
  pUVar1 = (UnaryPropertyExprSyntax *)
           allocate(in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  op.info = in_RSI;
  op._0_8_ = in_RDX;
  slang::syntax::UnaryPropertyExprSyntax::UnaryPropertyExprSyntax
            ((UnaryPropertyExprSyntax *)in_RSI->location,op,(PropertyExprSyntax *)in_RSI->rawTextPtr
            );
  return pUVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }